

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O3

char * MyGame_InParentNamespace_parse_json_table
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  int iVar1;
  flatcc_builder_ref_t fVar2;
  char *pcVar3;
  int local_2c;
  
  *result = 0;
  iVar1 = flatcc_builder_start_table(ctx->ctx,0);
  if (iVar1 != 0) goto LAB_0010f7b0;
  if ((buf == end) || (*buf != '{')) {
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x15);
  }
  else {
    pcVar3 = buf + 1;
    if ((long)end - (long)pcVar3 < 2) {
LAB_0010f6ef:
      pcVar3 = flatcc_json_parser_space_ext(ctx,pcVar3,end);
    }
    else if (*pcVar3 < '!') {
      if ((*pcVar3 != ' ') || (buf[2] < '!')) goto LAB_0010f6ef;
      pcVar3 = buf + 2;
    }
    if ((pcVar3 == end) || (*pcVar3 != '}')) {
      local_2c = 1;
      buf = pcVar3;
      do {
        if (buf != end) {
          if (*buf == '.') {
            buf = flatcc_json_parser_set_error(ctx,buf,end,5);
          }
          else if (*buf == '\"') {
            buf = buf + 1;
            ctx->unquoted = 0;
          }
          else {
            ctx->unquoted = 1;
          }
        }
        pcVar3 = flatcc_json_parser_unmatched_symbol(ctx,buf,end);
        buf = flatcc_json_parser_object_end(ctx,pcVar3,end,&local_2c);
      } while (local_2c != 0);
    }
    else {
      buf = pcVar3 + 1;
      if ((long)end - (long)buf < 2) {
LAB_0010f800:
        buf = flatcc_json_parser_space_ext(ctx,buf,end);
      }
      else if (*buf < '!') {
        if ((*buf != ' ') || (pcVar3[2] < '!')) goto LAB_0010f800;
        buf = pcVar3 + 2;
      }
    }
  }
  if (ctx->error == 0) {
    fVar2 = flatcc_builder_end_table(ctx->ctx);
    *result = fVar2;
    if (fVar2 != 0) {
      return buf;
    }
  }
LAB_0010f7b0:
  pcVar3 = flatcc_json_parser_set_error(ctx,buf,end,0x23);
  return pcVar3;
}

Assistant:

static const char *MyGame_InParentNamespace_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    int more;

    *result = 0;
    if (flatcc_builder_start_table(ctx->ctx, 0)) goto failed;
    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        /* Table has no fields. */
        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
        buf = flatcc_json_parser_object_end(ctx, buf, end, &more);
    }
    if (ctx->error) goto failed;
    if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}